

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-tests.c
# Opt level: O2

int maybe_run_test(int argc,char **argv)

{
  int iVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  uint uVar4;
  uint uVar5;
  ssize_t sVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *__format;
  undefined4 in_register_0000003c;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  int64_t eval_b;
  uv_os_fd_t closed_fd;
  uv_os_fd_t open_fd;
  char buffer [256];
  
  lVar10 = CONCAT44(in_register_0000003c,argc);
  pcVar12 = *(char **)(lVar10 + 8);
  iVar1 = strcmp(pcVar12,"--list");
  if (iVar1 == 0) {
    print_tests((FILE *)_stdout);
    return 0;
  }
  iVar1 = strcmp(pcVar12,"ipc_helper_listen_before_write");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = strcmp(pcVar12,"ipc_helper_listen_after_write");
    if (iVar1 != 0) {
      iVar1 = strcmp(pcVar12,"ipc_helper_heavy_traffic_deadlock_bug");
      if (iVar1 == 0) {
        iVar1 = ipc_helper_heavy_traffic_deadlock_bug();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"ipc_send_recv_helper");
      if (iVar1 == 0) {
        iVar1 = ipc_send_recv_helper();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"ipc_helper_tcp_connection");
      if (iVar1 == 0) {
        iVar1 = ipc_helper_tcp_connection();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"ipc_helper_bind_twice");
      if (iVar1 == 0) {
        iVar1 = ipc_helper_bind_twice();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"ipc_helper_send_zero");
      if (iVar1 == 0) {
        iVar1 = ipc_helper_send_zero();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"stdio_over_pipes_helper");
      if (iVar1 == 0) {
        iVar1 = stdio_over_pipes_helper();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"spawn_helper1");
      if (iVar1 == 0) {
LAB_001105ad:
        notify_parent_process();
        return 1;
      }
      iVar1 = strcmp(pcVar12,"spawn_helper2");
      if (iVar1 == 0) {
        notify_parent_process();
        puts("hello world");
        return 1;
      }
      iVar1 = strcmp(pcVar12,"spawn_tcp_server_helper");
      if (iVar1 == 0) {
        notify_parent_process();
        iVar1 = spawn_tcp_server_helper();
        return iVar1;
      }
      iVar1 = strcmp(pcVar12,"spawn_helper3");
      if (iVar1 == 0) {
        notify_parent_process();
        pcVar12 = buffer;
        eval_b = (int64_t)fgets(pcVar12,0xff,_stdin);
        if (pcVar12 == (char *)eval_b) {
          buffer[0xff] = '\0';
          fputs(buffer,_stdout);
          return 1;
        }
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
        pcVar11 = "buffer";
        uVar8 = 0x9c;
        pcVar14 = "==";
        pcVar13 = "fgets(buffer, sizeof(buffer) - 1, stdin)";
      }
      else {
        iVar1 = strcmp(pcVar12,"spawn_helper4");
        if (iVar1 == 0) {
          notify_parent_process();
          do {
            uv_sleep(10000);
          } while( true );
        }
        iVar1 = strcmp(pcVar12,"spawn_helper5");
        if (iVar1 == 0) {
          notify_parent_process();
          do {
            sVar6 = write(3,"fourth stdio!\n",0xe);
            if (sVar6 != -1) break;
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
          fsync(3);
          return 1;
        }
        iVar1 = strcmp(pcVar12,"spawn_helper6");
        if (iVar1 == 0) {
          notify_parent_process();
          iVar1 = fprintf(_stdout,"hello world\n");
          pcVar12 = (char *)(long)iVar1;
          eval_b = 0;
          buffer._0_8_ = pcVar12;
          if ((long)pcVar12 < 1) {
            pcVar14 = ">";
            pcVar13 = "0";
            pcVar11 = "r";
            uVar8 = 0xc2;
          }
          else {
            iVar1 = fprintf(_stderr,"hello errworld\n");
            pcVar12 = (char *)(long)iVar1;
            eval_b = 0;
            if (0 < (long)pcVar12) {
              return 1;
            }
            pcVar14 = ">";
            pcVar13 = "0";
            pcVar11 = "r";
            uVar8 = 0xc5;
            buffer._0_8_ = pcVar12;
          }
        }
        else {
          iVar1 = strcmp(pcVar12,"spawn_helper7");
          if (iVar1 == 0) {
            notify_parent_process();
            pcVar12 = getenv("ENV_TEST");
            if (pcVar12 == (char *)0x0) {
              eval_b = 0;
              pcVar14 = "!=";
              pcVar12 = (char *)0x0;
              pcVar13 = "NULL";
              __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
              pcVar11 = "test";
              uVar8 = 0xd2;
              goto LAB_0011080a;
            }
            iVar1 = fprintf(_stdout,"%s",pcVar12);
            pcVar12 = (char *)(long)iVar1;
            eval_b = 0;
            if (0 < (long)pcVar12) {
              return 1;
            }
            pcVar14 = ">";
            pcVar13 = "0";
            pcVar11 = "r";
            uVar8 = 0xd5;
            buffer._0_8_ = pcVar12;
          }
          else {
            iVar1 = strcmp(pcVar12,"spawn_helper8");
            if (iVar1 == 0) {
              notify_parent_process();
              buffer[0] = '\x04';
              buffer[1] = '\0';
              buffer[2] = '\0';
              buffer[3] = '\0';
              buffer[4] = '\0';
              buffer[5] = '\0';
              buffer[6] = '\0';
              buffer[7] = '\0';
              eval_b = read(0,&closed_fd,4);
              if (buffer._0_8_ == eval_b) {
                buffer[0] = '\x04';
                buffer[1] = '\0';
                buffer[2] = '\0';
                buffer[3] = '\0';
                buffer[4] = '\0';
                buffer[5] = '\0';
                buffer[6] = '\0';
                buffer[7] = '\0';
                eval_b = read(0,&open_fd,4);
                if (buffer._0_8_ == eval_b) {
                  pcVar12 = (char *)(long)open_fd;
                  eval_b = 2;
                  if ((long)pcVar12 < 3) {
                    pcVar14 = ">";
                    pcVar13 = "2";
                    pcVar11 = "open_fd";
                    uVar8 = 0xef;
                    buffer._0_8_ = pcVar12;
                  }
                  else {
                    pcVar12 = (char *)(long)closed_fd;
                    eval_b = 2;
                    if ((long)pcVar12 < 3) {
                      pcVar14 = ">";
                      pcVar13 = "2";
                      pcVar11 = "closed_fd";
                      uVar8 = 0xf0;
                      buffer._0_8_ = pcVar12;
                    }
                    else {
                      buffer[0] = -1;
                      buffer[1] = -1;
                      buffer[2] = -1;
                      buffer[3] = -1;
                      buffer[4] = -1;
                      buffer[5] = -1;
                      buffer[6] = -1;
                      buffer[7] = -1;
                      eval_b = write(closed_fd,"x",1);
                      if (buffer._0_8_ == eval_b) {
                        return 1;
                      }
                      pcVar14 = "==";
                      pcVar13 = "write(closed_fd, \"x\", 1)";
                      pcVar11 = "-1";
                      uVar8 = 0xf4;
                      pcVar12 = (char *)buffer._0_8_;
                    }
                  }
                }
                else {
                  pcVar14 = "==";
                  pcVar13 = "read(0, &open_fd, sizeof(open_fd))";
                  pcVar11 = "sizeof(open_fd)";
                  uVar8 = 0xe4;
                  pcVar12 = (char *)buffer._0_8_;
                }
              }
              else {
                pcVar14 = "==";
                pcVar13 = "read(0, &closed_fd, sizeof(closed_fd))";
                pcVar11 = "sizeof(closed_fd)";
                uVar8 = 0xe3;
                pcVar12 = (char *)buffer._0_8_;
              }
            }
            else {
              iVar1 = strcmp(pcVar12,"spawn_helper9");
              if (iVar1 == 0) {
                notify_parent_process();
                spawn_stdin_stdout();
                return 1;
              }
              iVar1 = strcmp(pcVar12,"spawn_helper_setuid_setgid");
              if (iVar1 == 0) {
                uVar4 = atoi(*(char **)(lVar10 + 0x10));
                uVar5 = atoi(*(char **)(lVar10 + 0x18));
                buffer._0_8_ = ZEXT48(uVar4);
                _Var2 = getuid();
                eval_b = (int64_t)_Var2;
                if (buffer._0_8_ == eval_b) {
                  buffer._0_8_ = ZEXT48(uVar5);
                  _Var3 = getgid();
                  eval_b = (int64_t)_Var3;
                  if (buffer._0_8_ == eval_b) goto LAB_001105ad;
                  pcVar14 = "==";
                  pcVar13 = "getgid()";
                  pcVar11 = "gid";
                  uVar8 = 0x106;
                  pcVar12 = (char *)buffer._0_8_;
                }
                else {
                  pcVar14 = "==";
                  pcVar13 = "getuid()";
                  pcVar11 = "uid";
                  uVar8 = 0x105;
                  pcVar12 = (char *)buffer._0_8_;
                }
              }
              else {
                iVar1 = strcmp(pcVar12,"spawn_helper_affinity");
                if (iVar1 != 0) {
                  iVar1 = strcmp(pcVar12,"process_title_big_argv_helper");
                  if (iVar1 == 0) {
                    notify_parent_process();
                    process_title_big_argv();
                    return 0;
                  }
                  iVar1 = run_test(pcVar12,0,1);
                  return iVar1;
                }
                uVar4 = uv_cpumask_size();
                if ((int)uVar4 < 1) {
                  pcVar12 = "cpumask_size > 0";
                  uVar8 = 0x11d;
LAB_00110a21:
                  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
                          ,uVar8,pcVar12);
                  abort();
                }
                uVar5 = atoi(*(char **)(lVar10 + 0x10));
                if ((int)uVar5 < 0) {
                  pcVar12 = "cpu >= 0";
                  uVar8 = 0x120;
                  goto LAB_00110a21;
                }
                if (uVar4 <= uVar5) {
                  pcVar12 = "cpu < cpumask_size";
                  uVar8 = 0x121;
                  goto LAB_00110a21;
                }
                buffer[0x70] = '\0';
                buffer[0x71] = '\0';
                buffer[0x72] = '\0';
                buffer[0x73] = '\0';
                buffer[0x74] = '\0';
                buffer[0x75] = '\0';
                buffer[0x76] = '\0';
                buffer[0x77] = '\0';
                buffer[0x78] = '\0';
                buffer[0x79] = '\0';
                buffer[0x7a] = '\0';
                buffer[0x7b] = '\0';
                buffer[0x7c] = '\0';
                buffer[0x7d] = '\0';
                buffer[0x7e] = '\0';
                buffer[0x7f] = '\0';
                buffer[0x60] = '\0';
                buffer[0x61] = '\0';
                buffer[0x62] = '\0';
                buffer[99] = '\0';
                buffer[100] = '\0';
                buffer[0x65] = '\0';
                buffer[0x66] = '\0';
                buffer[0x67] = '\0';
                buffer[0x68] = '\0';
                buffer[0x69] = '\0';
                buffer[0x6a] = '\0';
                buffer[0x6b] = '\0';
                buffer[0x6c] = '\0';
                buffer[0x6d] = '\0';
                buffer[0x6e] = '\0';
                buffer[0x6f] = '\0';
                buffer[0x50] = '\0';
                buffer[0x51] = '\0';
                buffer[0x52] = '\0';
                buffer[0x53] = '\0';
                buffer[0x54] = '\0';
                buffer[0x55] = '\0';
                buffer[0x56] = '\0';
                buffer[0x57] = '\0';
                buffer[0x58] = '\0';
                buffer[0x59] = '\0';
                buffer[0x5a] = '\0';
                buffer[0x5b] = '\0';
                buffer[0x5c] = '\0';
                buffer[0x5d] = '\0';
                buffer[0x5e] = '\0';
                buffer[0x5f] = '\0';
                buffer[0x40] = '\0';
                buffer[0x41] = '\0';
                buffer[0x42] = '\0';
                buffer[0x43] = '\0';
                buffer[0x44] = '\0';
                buffer[0x45] = '\0';
                buffer[0x46] = '\0';
                buffer[0x47] = '\0';
                buffer[0x48] = '\0';
                buffer[0x49] = '\0';
                buffer[0x4a] = '\0';
                buffer[0x4b] = '\0';
                buffer[0x4c] = '\0';
                buffer[0x4d] = '\0';
                buffer[0x4e] = '\0';
                buffer[0x4f] = '\0';
                buffer[0x30] = '\0';
                buffer[0x31] = '\0';
                buffer[0x32] = '\0';
                buffer[0x33] = '\0';
                buffer[0x34] = '\0';
                buffer[0x35] = '\0';
                buffer[0x36] = '\0';
                buffer[0x37] = '\0';
                buffer[0x38] = '\0';
                buffer[0x39] = '\0';
                buffer[0x3a] = '\0';
                buffer[0x3b] = '\0';
                buffer[0x3c] = '\0';
                buffer[0x3d] = '\0';
                buffer[0x3e] = '\0';
                buffer[0x3f] = '\0';
                buffer[0x20] = '\0';
                buffer[0x21] = '\0';
                buffer[0x22] = '\0';
                buffer[0x23] = '\0';
                buffer[0x24] = '\0';
                buffer[0x25] = '\0';
                buffer[0x26] = '\0';
                buffer[0x27] = '\0';
                buffer[0x28] = '\0';
                buffer[0x29] = '\0';
                buffer[0x2a] = '\0';
                buffer[0x2b] = '\0';
                buffer[0x2c] = '\0';
                buffer[0x2d] = '\0';
                buffer[0x2e] = '\0';
                buffer[0x2f] = '\0';
                buffer[0x10] = '\0';
                buffer[0x11] = '\0';
                buffer[0x12] = '\0';
                buffer[0x13] = '\0';
                buffer[0x14] = '\0';
                buffer[0x15] = '\0';
                buffer[0x16] = '\0';
                buffer[0x17] = '\0';
                buffer[0x18] = '\0';
                buffer[0x19] = '\0';
                buffer[0x1a] = '\0';
                buffer[0x1b] = '\0';
                buffer[0x1c] = '\0';
                buffer[0x1d] = '\0';
                buffer[0x1e] = '\0';
                buffer[0x1f] = '\0';
                buffer[0] = '\0';
                buffer[1] = '\0';
                buffer[2] = '\0';
                buffer[3] = '\0';
                buffer[4] = '\0';
                buffer[5] = '\0';
                buffer[6] = '\0';
                buffer[7] = '\0';
                buffer[8] = '\0';
                buffer[9] = '\0';
                buffer[10] = '\0';
                buffer[0xb] = '\0';
                buffer[0xc] = '\0';
                buffer[0xd] = '\0';
                buffer[0xe] = '\0';
                buffer[0xf] = '\0';
                eval_b = 0;
                iVar1 = sched_getaffinity(0,0x80,(cpu_set_t *)buffer);
                if (iVar1 != 0) {
                  piVar7 = __errno_location();
                  eval_b = (int64_t)*piVar7;
                }
                _closed_fd = (char *)0x0;
                if (eval_b == 0) {
                  uVar9 = 0;
                  while( true ) {
                    if (uVar4 == uVar9) {
                      return 1;
                    }
                    if (uVar9 < 0x400) {
                      eval_b = (int64_t)((*(ulong *)(buffer + (uVar9 >> 6) * 8) >> (uVar9 & 0x3f) &
                                         1) != 0);
                    }
                    else {
                      eval_b = 0;
                    }
                    _closed_fd = (char *)(ulong)(uVar5 == uVar9);
                    if ((char *)eval_b != _closed_fd) break;
                    uVar9 = uVar9 + 1;
                  }
                  pcVar13 = "(i == cpu)";
                  pcVar11 = 
                  "(__extension__ ({ size_t __cpu = (i); __cpu / 8 < (sizeof (cpu_set_t)) ? ((((const __cpu_mask *) ((&cpuset)->__bits))[((__cpu) / (8 * sizeof (__cpu_mask)))] & ((__cpu_mask) 1 << ((__cpu) % (8 * sizeof (__cpu_mask)))))) != 0 : 0; }))"
                  ;
                  uVar8 = 0x137;
                }
                else {
                  pcVar13 = "0";
                  pcVar11 = "r";
                  uVar8 = 0x135;
                }
                pcVar14 = "==";
                pcVar12 = (char *)eval_b;
                eval_b = (int64_t)_closed_fd;
              }
            }
          }
        }
        __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
      }
LAB_0011080a:
      fprintf(_stderr,__format,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/run-tests.c"
              ,uVar8,pcVar11,pcVar14,pcVar13,pcVar12,pcVar14,eval_b);
      abort();
    }
    iVar1 = 1;
  }
  iVar1 = ipc_helper(iVar1);
  return iVar1;
}

Assistant:

static int maybe_run_test(int argc, char **argv) {
  if (strcmp(argv[1], "--list") == 0) {
    print_tests(stdout);
    return 0;
  }

  if (strcmp(argv[1], "ipc_helper_listen_before_write") == 0) {
    return ipc_helper(0);
  }

  if (strcmp(argv[1], "ipc_helper_listen_after_write") == 0) {
    return ipc_helper(1);
  }

  if (strcmp(argv[1], "ipc_helper_heavy_traffic_deadlock_bug") == 0) {
    return ipc_helper_heavy_traffic_deadlock_bug();
  }

  if (strcmp(argv[1], "ipc_send_recv_helper") == 0) {
    return ipc_send_recv_helper();
  }

  if (strcmp(argv[1], "ipc_helper_tcp_connection") == 0) {
    return ipc_helper_tcp_connection();
  }

  if (strcmp(argv[1], "ipc_helper_bind_twice") == 0) {
    return ipc_helper_bind_twice();
  }

  if (strcmp(argv[1], "ipc_helper_send_zero") == 0) {
    return ipc_helper_send_zero();
  }

  if (strcmp(argv[1], "stdio_over_pipes_helper") == 0) {
    return stdio_over_pipes_helper();
  }

  if (strcmp(argv[1], "spawn_helper1") == 0) {
    notify_parent_process();
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper2") == 0) {
    notify_parent_process();
    printf("hello world\n");
    return 1;
  }

  if (strcmp(argv[1], "spawn_tcp_server_helper") == 0) {
    notify_parent_process();
    return spawn_tcp_server_helper();
  }

  if (strcmp(argv[1], "spawn_helper3") == 0) {
    char buffer[256];
    notify_parent_process();
    ASSERT_PTR_EQ(buffer, fgets(buffer, sizeof(buffer) - 1, stdin));
    buffer[sizeof(buffer) - 1] = '\0';
    fputs(buffer, stdout);
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper4") == 0) {
    notify_parent_process();
    /* Never surrender, never return! */
    for (;;) uv_sleep(10000);
  }

  if (strcmp(argv[1], "spawn_helper5") == 0) {
    const char out[] = "fourth stdio!\n";
    notify_parent_process();
    {
#ifdef _WIN32
      DWORD bytes;
      WriteFile((HANDLE) _get_osfhandle(3), out, sizeof(out) - 1, &bytes, NULL);
#else
      ssize_t r;

      do
        r = write(3, out, sizeof(out) - 1);
      while (r == -1 && errno == EINTR);

      fsync(3);
#endif
    }
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper6") == 0) {
    int r;

    notify_parent_process();

    r = fprintf(stdout, "hello world\n");
    ASSERT_GT(r, 0);

    r = fprintf(stderr, "hello errworld\n");
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper7") == 0) {
    int r;
    char *test;

    notify_parent_process();

    /* Test if the test value from the parent is still set */
    test = getenv("ENV_TEST");
    ASSERT_NOT_NULL(test);

    r = fprintf(stdout, "%s", test);
    ASSERT_GT(r, 0);

    return 1;
  }

  if (strcmp(argv[1], "spawn_helper8") == 0) {
    uv_os_fd_t closed_fd;
    uv_os_fd_t open_fd;
#ifdef _WIN32
    DWORD flags;
    HMODULE kernelbase_module;
    sCompareObjectHandles pCompareObjectHandles; /* function introduced in Windows 10 */
#endif
    notify_parent_process();
    ASSERT_EQ(sizeof(closed_fd), read(0, &closed_fd, sizeof(closed_fd)));
    ASSERT_EQ(sizeof(open_fd), read(0, &open_fd, sizeof(open_fd)));
#ifdef _WIN32
    ASSERT_GT((intptr_t) closed_fd, 0);
    ASSERT_GT((intptr_t) open_fd, 0);
    ASSERT_NE(0, GetHandleInformation(open_fd, &flags));
    kernelbase_module = GetModuleHandleA("kernelbase.dll");
    pCompareObjectHandles = (sCompareObjectHandles)
        GetProcAddress(kernelbase_module, "CompareObjectHandles");
    ASSERT_NE(pCompareObjectHandles == NULL || \
              !pCompareObjectHandles(open_fd, closed_fd), 0);
#else
    ASSERT_GT(open_fd, 2);
    ASSERT_GT(closed_fd, 2);
# if defined(__PASE__)  /* On IBMi PASE, write() returns 1 */
    ASSERT_EQ(1, write(closed_fd, "x", 1));
# else
    ASSERT_EQ(-1, write(closed_fd, "x", 1));
# endif  /* !__PASE__ */
#endif
    return 1;
  }

  if (strcmp(argv[1], "spawn_helper9") == 0) {
    notify_parent_process();
    spawn_stdin_stdout();
    return 1;
  }

#ifndef _WIN32
  if (strcmp(argv[1], "spawn_helper_setuid_setgid") == 0) {
    uv_uid_t uid = atoi(argv[2]);
    uv_gid_t gid = atoi(argv[3]);

    ASSERT_EQ(uid, getuid());
    ASSERT_EQ(gid, getgid());
    notify_parent_process();

    return 1;
  }
#endif  /* !_WIN32 */

#if !defined(NO_CPU_AFFINITY)
  if (strcmp(argv[1], "spawn_helper_affinity") == 0) {
    int i;
    int r;
    int cpu;
    int cpumask_size;
#ifdef _WIN32
    DWORD_PTR procmask;
    DWORD_PTR sysmask;
#elif defined(__linux__)
    cpu_set_t cpuset;
#else
    cpuset_t cpuset;
#endif

    cpumask_size = uv_cpumask_size();
    ASSERT(cpumask_size > 0);

    cpu = atoi(argv[2]);
    ASSERT(cpu >= 0);
    ASSERT(cpu < cpumask_size);

    /* verify the mask has the cpu we expect */
#ifdef _WIN32
    r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
    ASSERT(r != 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT(((procmask & (((DWORD_PTR)1) << i)) != 0) == (i == cpu));
    }
#else
    CPU_ZERO(&cpuset);
#ifdef __linux__
    r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
    if (r)
      r = errno;
    else
      r = 0;
#else
    r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
    ASSERT_EQ(r, 0);
    for (i = 0; i < cpumask_size; ++i) {
      ASSERT_EQ(CPU_ISSET(i, &cpuset), (i == cpu));
    }
#endif

    return 1;
  }
#endif

  if (strcmp(argv[1], "process_title_big_argv_helper") == 0) {
    notify_parent_process();
    process_title_big_argv();
    return 0;
  }

  return run_test(argv[1], 0, 1);
}